

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O2

void bk_lib::detail::fill<Clasp::DomainHeuristic::DomAction>
               (DomAction *first,DomAction *last,DomAction *x)

{
  uint16 uVar1;
  
  switch((uint)(((long)last - (long)first) / 0xc) & 7) {
  case 0:
    for (; first != last; first = first + 1) {
      uVar1 = x->prio;
      first->bias = x->bias;
      first->prio = uVar1;
      *(undefined8 *)first = *(undefined8 *)x;
      first = first + 1;
switchD_00184d1f_caseD_7:
      uVar1 = x->prio;
      first->bias = x->bias;
      first->prio = uVar1;
      *(undefined8 *)first = *(undefined8 *)x;
      first = first + 1;
switchD_00184d1f_caseD_6:
      uVar1 = x->prio;
      first->bias = x->bias;
      first->prio = uVar1;
      *(undefined8 *)first = *(undefined8 *)x;
      first = first + 1;
switchD_00184d1f_caseD_5:
      uVar1 = x->prio;
      first->bias = x->bias;
      first->prio = uVar1;
      *(undefined8 *)first = *(undefined8 *)x;
      first = first + 1;
switchD_00184d1f_caseD_4:
      uVar1 = x->prio;
      first->bias = x->bias;
      first->prio = uVar1;
      *(undefined8 *)first = *(undefined8 *)x;
      first = first + 1;
switchD_00184d1f_caseD_3:
      uVar1 = x->prio;
      first->bias = x->bias;
      first->prio = uVar1;
      *(undefined8 *)first = *(undefined8 *)x;
      first = first + 1;
switchD_00184d1f_caseD_2:
      uVar1 = x->prio;
      first->bias = x->bias;
      first->prio = uVar1;
      *(undefined8 *)first = *(undefined8 *)x;
      first = first + 1;
switchD_00184d1f_caseD_1:
      uVar1 = x->prio;
      first->bias = x->bias;
      first->prio = uVar1;
      *(undefined8 *)first = *(undefined8 *)x;
    }
    break;
  case 1:
    goto switchD_00184d1f_caseD_1;
  case 2:
    goto switchD_00184d1f_caseD_2;
  case 3:
    goto switchD_00184d1f_caseD_3;
  case 4:
    goto switchD_00184d1f_caseD_4;
  case 5:
    goto switchD_00184d1f_caseD_5;
  case 6:
    goto switchD_00184d1f_caseD_6;
  case 7:
    goto switchD_00184d1f_caseD_7;
  }
  return;
}

Assistant:

void fill(T* first, T* last, const T& x) {
		assert(first <= last);
		switch ((last - first) & 7u)
		{
		case 0:
				while (first != last)
				{
				new(first++) T(x);
		case 7: new(first++) T(x);
		case 6: new(first++) T(x);
		case 5: new(first++) T(x);
		case 4: new(first++) T(x);
		case 3: new(first++) T(x);
		case 2: new(first++) T(x);
		case 1: new(first++) T(x);
				assert(first <= last);
				}
		}
	}